

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  local_iterator it;
  local_iterator it_00;
  local_iterator it_01;
  local_iterator it_02;
  bool bVar1;
  undefined1 uVar2;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  char *file;
  long in_RDI;
  AssertionResult gtest_ar__2;
  const_local_iterator e2;
  const_local_iterator b2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  const_local_iterator e;
  const_local_iterator b;
  size_type bucknum;
  key_type *in_stack_fffffffffffffd68;
  bool *success;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd70;
  const_local_iterator *this_01;
  undefined4 uVar3;
  int in_stack_fffffffffffffd84;
  undefined4 uVar4;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd90;
  undefined4 uVar5;
  Type type;
  AssertHelper *in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda8;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  char *in_stack_fffffffffffffdd8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffde0;
  AssertionResult *in_stack_fffffffffffffde8;
  AssertionResult *assertion_result;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffdf0;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  undefined8 local_200;
  const_iterator local_1f8;
  const_local_iterator *local_1d0;
  undefined8 local_1c0;
  dense_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_1b8;
  string local_198 [55];
  undefined1 local_161;
  AssertionResult local_160 [2];
  string local_138 [71];
  undefined1 local_f1;
  AssertionResult local_f0;
  bool *local_e0;
  const_local_iterator *local_d8;
  undefined8 local_c8;
  const_iterator local_c0;
  const_local_iterator *local_98;
  undefined8 local_88;
  dense_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_80;
  key_type local_60;
  size_type local_58;
  value_type local_28;
  pair<int,_int> local_14;
  int local_c;
  
  uVar5 = (undefined4)in_RDI;
  type = (Type)((ulong)in_RDI >> 0x20);
  this_00 = (HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_28 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffd90,(int)((ulong)this_00 >> 0x20));
  local_14 = local_28.first;
  local_c = local_28.second;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
  file = (char *)(CONCAT44(type,uVar5) + 0x10);
  local_60 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(this_00,in_stack_fffffffffffffd84);
  local_58 = google::
             BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  it.super_local_iterator.pos._0_4_ = (int)this_00;
  it.super_local_iterator.ht =
       (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_88;
  it.super_local_iterator.pos._4_4_ = (int)((ulong)this_00 >> 0x20);
  it.super_local_iterator.end = (pointer)file;
  it.parent_._0_4_ = uVar5;
  it.parent_._4_4_ = type;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(local_98,it);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  uVar3 = (undefined4)local_c8;
  uVar4 = (undefined4)((ulong)local_c8 >> 0x20);
  it_00.super_local_iterator.pos._0_4_ = (int)this_00;
  it_00.super_local_iterator.ht =
       (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8;
  it_00.super_local_iterator.pos._4_4_ = (int)((ulong)this_00 >> 0x20);
  it_00.super_local_iterator.end = (pointer)file;
  it_00.parent_._0_4_ = uVar5;
  it_00.parent_._4_4_ = type;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(local_d8,it_00);
  local_f1 = google::
             dense_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator!=(&local_80,&local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d8,local_e0,(type *)0xaf3b27);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  success = local_e0;
  this_01 = local_d8;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0._M_head_impl,
               in_stack_fffffffffffffdd8,
               (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffda0,type,file,(int)((ulong)this_00 >> 0x20),
               (char *)CONCAT44(uVar4,uVar3));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    std::__cxx11::string::~string(local_138);
    testing::Message::~Message((Message *)0xaf3be8);
    success = local_e0;
    this_01 = local_d8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaf3c7c);
  google::
  dense_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(&this_01->super_const_local_iterator,(int)((ulong)success >> 0x20));
  local_161 = google::
              dense_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_80,&local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,success,(type *)0xaf3cca);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0._M_head_impl,
               in_stack_fffffffffffffdd8,
               (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffda0,type,file,(int)((ulong)this_00 >> 0x20),
               (char *)CONCAT44(uVar4,uVar3));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_198);
    testing::Message::~Message((Message *)0xaf3d9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaf3e34);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  it_01.super_local_iterator.pos._0_4_ = (int)this_00;
  it_01.super_local_iterator.ht =
       (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_1c0;
  it_01.super_local_iterator.pos._4_4_ = (int)((ulong)this_00 >> 0x20);
  it_01.super_local_iterator.end = (pointer)file;
  it_01.parent_._0_4_ = uVar5;
  it_01.parent_._4_4_ = type;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(local_1d0,it_01);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  uVar3 = (undefined4)local_200;
  uVar4 = (undefined4)((ulong)local_200 >> 0x20);
  it_02.super_local_iterator.pos._0_4_ = (int)this_00;
  it_02.super_local_iterator.ht =
       (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_200;
  it_02.super_local_iterator.pos._4_4_ = (int)((ulong)this_00 >> 0x20);
  it_02.super_local_iterator.end = (pointer)file;
  it_02.parent_._0_4_ = uVar5;
  it_02.parent_._4_4_ = type;
  assertion_result = in_stack_fffffffffffffde8;
  this_02 = in_stack_fffffffffffffdf0;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator
            ((const_local_iterator *)in_stack_fffffffffffffdf0,it_02);
  uVar2 = google::
          dense_hashtable_const_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_1b8,&local_1f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffdf0,&in_stack_fffffffffffffde8->success_,
             (type *)0xaf3f14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdd8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)in_stack_fffffffffffffde0._M_head_impl,
               in_stack_fffffffffffffdd8,(char *)CONCAT17(uVar2,in_stack_fffffffffffffdd0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffda0,type,file,(int)((ulong)this_00 >> 0x20),
               (char *)CONCAT44(uVar4,uVar3));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
    testing::Message::~Message((Message *)0xaf3fc6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaf4048);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstLocalIterators) {
  this->ht_.insert(this->UniqueObject(1));
  const typename TypeParam::size_type bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  typename TypeParam::const_local_iterator b = this->ht_.begin(bucknum);
  typename TypeParam::const_local_iterator e = this->ht_.end(bucknum);
  EXPECT_TRUE(b != e);
  b++;
  EXPECT_TRUE(b == e);
  typename TypeParam::const_local_iterator b2 = this->ht_.begin(bucknum ^ 1);
  typename TypeParam::const_local_iterator e2 = this->ht_.end(bucknum ^ 1);
  EXPECT_TRUE(b2 == e2);
}